

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load-balance-sampling.hpp
# Opt level: O0

void diy::detail::recv_req
               (AuxBlock *param_1,ProxyWithLink *cp,vector<int,_std::allocator<int>_> *req_procs)

{
  value_type_conflict *__x;
  value_type_conflict *pvVar1;
  size_t sVar2;
  int v;
  int gid;
  int i;
  vector<int,_std::allocator<int>_> incoming_gids;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  Proxy *in_stack_ffffffffffffffa0;
  Proxy *this;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffc4;
  
  this = (Proxy *)&stack0xffffffffffffffd0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1a3092);
  Master::Proxy::incoming
            ((Proxy *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  iVar3 = 0;
  while( true ) {
    __x = (value_type_conflict *)(long)iVar3;
    pvVar1 = (value_type_conflict *)
             std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffd0);
    if (pvVar1 <= __x) break;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffd0,(long)iVar3);
    in_stack_ffffffffffffffa0 =
         (Proxy *)Master::Proxy::incoming(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    sVar2 = MemoryBuffer::size((MemoryBuffer *)0x1a3104);
    if (sVar2 != 0) {
      Master::Proxy::dequeue<int>
                (this,(int)((ulong)__x >> 0x20),&in_stack_ffffffffffffffa0->gid_,
                 (_func_void_BinaryBuffer_ptr_int_ptr *)
                 CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)this,__x);
    }
    iVar3 = iVar3 + 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
  return;
}

Assistant:

inline void recv_req(AuxBlock*,                                // local block (unused)
              const diy::Master::ProxyWithLink& cp,     // communication proxy for neighbor blocks
              std::vector<int>& req_procs)              // processes requesting work info
{
    std::vector<int> incoming_gids;
    cp.incoming(incoming_gids);

    // for anything incoming, dequeue data received in the last exchange
    for (int i = 0; i < incoming_gids.size(); i++)
    {
        int gid = incoming_gids[i];
        if (cp.incoming(gid).size())
        {
            int v;
            cp.dequeue(gid, v);
            req_procs.push_back(gid);                   // aux_master has 1 gid per proc, so gid = proc
        }
    }
}